

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::AssertionItemPortSyntax::AssertionItemPortSyntax
          (AssertionItemPortSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token local,Token direction
          ,DataTypeSyntax *type,Token name,
          SyntaxList<slang::syntax::VariableDimensionSyntax> *dimensions,
          EqualsAssertionArgClauseSyntax *defaultValue)

{
  Token TVar1;
  iterator ppAVar2;
  DataTypeSyntax *pDVar3;
  iterator ppVVar4;
  VariableDimensionSyntax *child_1;
  iterator __end2_1;
  iterator __begin2_1;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *__range2_1;
  AttributeInstanceSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *__range2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_38;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  AssertionItemPortSyntax *this_local;
  Token direction_local;
  Token local_local;
  
  TVar1 = name;
  direction_local._0_8_ = direction.info;
  this_local = direction._0_8_;
  direction_local.info = local._0_8_;
  local_38 = attributes;
  attributes_local = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this;
  SyntaxNode::SyntaxNode(&this->super_SyntaxNode,AssertionItemPort);
  SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList(&this->attributes,local_38);
  *(Info **)&this->local = direction_local.info;
  (this->local).info = local.info;
  *(AssertionItemPortSyntax **)&this->direction = this_local;
  (this->direction).info = (Info *)direction_local._0_8_;
  __range2 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)type;
  not_null<slang::syntax::DataTypeSyntax*>::not_null<slang::syntax::DataTypeSyntax*,void>
            ((not_null<slang::syntax::DataTypeSyntax*> *)&this->type,(DataTypeSyntax **)&__range2);
  (this->name).kind = name.kind;
  (this->name).field_0x2 = name._2_1_;
  (this->name).numFlags = (NumericTokenFlags)name.numFlags.raw;
  (this->name).rawLen = name.rawLen;
  name.info = TVar1.info;
  (this->name).info = name.info;
  SyntaxList<slang::syntax::VariableDimensionSyntax>::SyntaxList(&this->dimensions,dimensions);
  this->defaultValue = defaultValue;
  (this->attributes).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  __end2 = nonstd::span_lite::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
           ::begin(&(this->attributes).
                    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>);
  ppAVar2 = nonstd::span_lite::
            span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::end
                      (&(this->attributes).
                        super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
                      );
  for (; __end2 != ppAVar2; __end2 = __end2 + 1) {
    ((*__end2)->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  pDVar3 = not_null<slang::syntax::DataTypeSyntax_*>::operator->(&this->type);
  (pDVar3->super_ExpressionSyntax).super_SyntaxNode.parent = &this->super_SyntaxNode;
  (this->dimensions).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  __end2_1 = nonstd::span_lite::
             span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::begin
                       (&(this->dimensions).
                         super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
                       );
  ppVVar4 = nonstd::span_lite::
            span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::end
                      (&(this->dimensions).
                        super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
                      );
  for (; __end2_1 != ppVVar4; __end2_1 = __end2_1 + 1) {
    ((*__end2_1)->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  if (this->defaultValue != (EqualsAssertionArgClauseSyntax *)0x0) {
    (this->defaultValue->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  return;
}

Assistant:

AssertionItemPortSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token local, Token direction, DataTypeSyntax& type, Token name, const SyntaxList<VariableDimensionSyntax>& dimensions, EqualsAssertionArgClauseSyntax* defaultValue) :
        SyntaxNode(SyntaxKind::AssertionItemPort), attributes(attributes), local(local), direction(direction), type(&type), name(name), dimensions(dimensions), defaultValue(defaultValue) {
        this->attributes.parent = this;
        for (auto child : this->attributes)
            child->parent = this;
        this->type->parent = this;
        this->dimensions.parent = this;
        for (auto child : this->dimensions)
            child->parent = this;
        if (this->defaultValue) this->defaultValue->parent = this;
    }